

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O0

uint8_t * __thiscall SRUP_Crypto::DecryptF(SRUP_Crypto *this,char *keyfile)

{
  int iVar1;
  RSA *rsa_key;
  undefined4 extraout_var;
  RSA *key;
  char *keyfile_local;
  SRUP_Crypto *this_local;
  
  rsa_key = getPrivateKeyF(keyfile);
  if (rsa_key == (RSA *)0x0) {
    this_local = (SRUP_Crypto *)0x0;
  }
  else {
    iVar1 = _decrypt(this,rsa_key);
    this_local = (SRUP_Crypto *)CONCAT44(extraout_var,iVar1);
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* SRUP_Crypto::DecryptF(char *keyfile)
{
    RSA* key;
    key = getPrivateKeyF(keyfile);
    if (key != nullptr)
        return _decrypt(key);
    else
        return nullptr;
}